

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# transform.cc
# Opt level: O2

string * __thiscall
kratos::LiftGenVarInstanceVisitor::find_common_instance_name_abi_cxx11_
          (string *__return_storage_ptr__,LiftGenVarInstanceVisitor *this,
          vector<kratos::ModuleInstantiationStmt_*,_std::allocator<kratos::ModuleInstantiationStmt_*>_>
          *generators)

{
  undefined1 *this_00;
  _func_int **pp_Var1;
  long lVar2;
  _func_int **pp_Var3;
  uint64_t i;
  ulong uVar4;
  uint64_t s;
  ulong uVar5;
  stringstream local_1e0 [8];
  stringstream gen_inst_name;
  
  std::__cxx11::stringstream::stringstream(local_1e0);
  lVar2 = *(long *)(*(this->super_IRVisitor)._vptr_IRVisitor + 0x160);
  for (uVar5 = 0; uVar5 < *(ulong *)(lVar2 + 0xa0); uVar5 = uVar5 + 1) {
    pp_Var3 = (this->super_IRVisitor)._vptr_IRVisitor;
    uVar4 = 1;
    while (uVar4 < (ulong)(*(long *)&(this->super_IRVisitor).level - (long)pp_Var3 >> 3)) {
      pp_Var1 = pp_Var3 + uVar4;
      uVar4 = uVar4 + 1;
      if (*(char *)(*(long *)(*(long *)(*pp_Var1 + 0x160) + 0x98) + uVar5) !=
          *(char *)(*(long *)(lVar2 + 0x98) + uVar5)) goto LAB_001ca755;
    }
    std::operator<<((ostream *)&gen_inst_name.field_0x8,*(char *)(*(long *)(lVar2 + 0x98) + uVar5));
  }
LAB_001ca755:
  std::__cxx11::stringbuf::str();
  this_00 = &gen_inst_name.field_0x180;
  while ((__return_storage_ptr__->_M_dataplus)._M_p[__return_storage_ptr__->_M_string_length - 1] ==
         '_') {
    std::__cxx11::string::substr((ulong)this_00,(ulong)__return_storage_ptr__);
    std::__cxx11::string::operator=((string *)__return_storage_ptr__,(string *)this_00);
    std::__cxx11::string::~string((string *)this_00);
  }
  if (__return_storage_ptr__->_M_string_length == 0) {
    std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                   &gen_inst_name.field_0x180,"genblk_",
                   (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                   (*(long *)(*(this->super_IRVisitor)._vptr_IRVisitor + 0x160) + 0x78));
    std::__cxx11::string::operator=
              ((string *)__return_storage_ptr__,(string *)&gen_inst_name.field_0x180);
    std::__cxx11::string::~string((string *)&gen_inst_name.field_0x180);
  }
  std::__cxx11::stringstream::~stringstream(local_1e0);
  return __return_storage_ptr__;
}

Assistant:

static std::string find_common_instance_name(
        const std::vector<ModuleInstantiationStmt*>& generators) {
        std::stringstream gen_inst_name;
        auto const& inst_ref = generators[0]->target()->instance_name;
        for (uint64_t s = 0; s < inst_ref.size(); s++) {
            bool diff = false;
            for (uint64_t i = 1; i < generators.size(); i++) {
                auto const& c = generators[i]->target()->instance_name[s];
                if (c != inst_ref[s]) {
                    diff = true;
                    break;
                }
            }
            if (diff) {
                break;
            } else {
                gen_inst_name << inst_ref[s];
            }
        }
        auto str = gen_inst_name.str();
        // remote _ at the end
        while (str[str.size() - 1] == '_') {
            str = str.substr(0, str.size() - 1);
        }
        // if it's empty, use gen_blk and the definition name
        if (str.empty()) {
            str = "genblk_" + generators[0]->target()->name;
        }
        return str;
    }